

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventloop.cpp
# Opt level: O0

void __thiscall
QEventLoop::processEvents(QEventLoop *this,ProcessEventsFlags flags,QDeadlineTimer deadline)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> other;
  QFlags<QEventLoop::ProcessEventsFlag> QVar3;
  QEventLoopPrivate *this_00;
  QFlags<QEventLoop::ProcessEventsFlag> *in_RDI;
  long in_FS_OFFSET;
  QEventLoopPrivate *d;
  QFlags<QEventLoop::ProcessEventsFlag> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  this_00 = d_func((QEventLoop *)0x357338);
  QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x35734b);
  bVar2 = QThreadData::hasEventDispatcher((QThreadData *)0x357353);
  if (bVar2) {
    do {
      other.i = (Int)::operator~((enum_type)((ulong)in_RDI >> 0x20));
      QVar3 = QFlags<QEventLoop::ProcessEventsFlag>::operator&
                        (in_RDI,(QFlags<QEventLoop::ProcessEventsFlag>)other.i);
      bVar2 = processEvents((QEventLoop *)
                            CONCAT44(QVar3.
                                     super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                                     super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i,other.i),
                            (QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
                            SUB84((ulong)pQVar4 >> 0x20,0));
      if (!bVar2) break;
      bVar2 = QDeadlineTimer::hasExpired((QDeadlineTimer *)this_00);
    } while (!bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEventLoop::processEvents(ProcessEventsFlags flags, QDeadlineTimer deadline)
{
    Q_D(QEventLoop);
    if (!d->threadData.loadRelaxed()->hasEventDispatcher())
        return;

    while (processEvents(flags & ~WaitForMoreEvents)) {
        if (deadline.hasExpired())
            break;
    }
}